

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86.cpp
# Opt level: O1

int __thiscall
ncnn::MultiHeadAttention_x86::forward
          (MultiHeadAttention_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  pointer pMVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  size_t sVar8;
  long *plVar9;
  Allocator *pAVar10;
  int iVar11;
  undefined4 uVar12;
  long *plVar13;
  undefined4 uVar14;
  void *pvVar15;
  Allocator *pAVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  void *pvVar22;
  pointer pMVar23;
  pointer pMVar24;
  void *pvVar25;
  Option opt1;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_bottom_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_bottom_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_top_blobs;
  long local_318;
  value_type local_308;
  long local_2c0;
  long local_2b8;
  int local_2ac;
  Mat local_2a8;
  long local_258;
  Option *local_250;
  long local_248;
  MultiHeadAttention_x86 *local_240;
  Mat local_238;
  void *local_1e8;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 local_1d0;
  long *local_1c8;
  undefined4 uStack_1c0;
  int iStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 local_1b0;
  undefined8 local_1a8;
  void *local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 local_180;
  long *local_178;
  undefined4 uStack_170;
  int iStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined4 local_160;
  undefined8 local_158;
  Mat local_148;
  Mat local_f8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_b0;
  pointer local_a8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_a0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_88;
  int iStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  int local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_48;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar18 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar4;
  pMVar24 = pMVar4;
  if ((lVar18 != 0x48) &&
     ((lVar18 != 0x90 ||
      (*(int *)(&this->field_0xe4 + (long)this->_vptr_MultiHeadAttention_x86[-3]) == 0)))) {
    pMVar24 = pMVar4 + 1;
  }
  pMVar23 = pMVar4;
  if (lVar18 != 0x48) {
    lVar19 = (lVar18 >> 3) * -0x71c71c71c71c71c7;
    if (lVar19 == 3) {
      pMVar23 = pMVar24;
      if (*(int *)(&this->field_0xe4 + (long)this->_vptr_MultiHeadAttention_x86[-3]) != 0)
      goto LAB_0051d922;
    }
    else if (lVar19 == 2) {
      if (*(int *)(&this->field_0xe4 + (long)this->_vptr_MultiHeadAttention_x86[-3]) == 0) {
        pMVar23 = pMVar24;
      }
      goto LAB_0051d922;
    }
    pMVar23 = pMVar4 + 2;
  }
LAB_0051d922:
  if (*(int *)(&this->field_0xe4 + (long)this->_vptr_MultiHeadAttention_x86[-3]) == 0) {
    local_238.cstep = 0;
    local_238.data = (void *)0x0;
    local_238.refcount._0_4_ = 0;
    local_238.refcount._4_4_ = 0;
    local_238.elemsize._0_4_ = 0;
    local_238.elemsize._4_4_ = 0;
    local_238.elempack = 0;
    local_238.allocator = (Allocator *)0x0;
    local_238.dims = 0;
    local_238.w = 0;
    local_238.h = 0;
    local_238.d = 0;
    local_238.c = 0;
  }
  else {
    local_238.data = *(void **)((long)pMVar4 + lVar18 + -0x48);
    piVar5 = *(int **)((long)pMVar4 + lVar18 + -0x40);
    local_238.refcount._0_4_ = SUB84(piVar5,0);
    local_238.refcount._4_4_ = (undefined4)((ulong)piVar5 >> 0x20);
    uVar6 = *(undefined8 *)((long)pMVar4 + lVar18 + -0x38);
    local_238.elemsize._0_4_ = (undefined4)uVar6;
    local_238.elemsize._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
    local_238.elempack = *(int *)((long)pMVar4 + lVar18 + -0x30);
    local_238.allocator = *(Allocator **)((long)pMVar4 + lVar18 + -0x28);
    puVar1 = (undefined8 *)((long)pMVar4 + lVar18 + -0x20);
    uVar6 = *puVar1;
    uVar7 = puVar1[1];
    local_238.dims = (int)uVar6;
    local_238.w = (int)((ulong)uVar6 >> 0x20);
    local_238.h = (int)uVar7;
    local_238.d = (int)((ulong)uVar7 >> 0x20);
    local_238.c = *(int *)((long)pMVar4 + lVar18 + -0x10);
    local_238.cstep = *(ulong *)((long)pMVar4 + lVar18 + -8);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
  }
  local_2a8.cstep = 0;
  local_2a8.data = (void *)0x0;
  local_2a8.refcount._0_4_ = 0;
  local_2a8.refcount._4_4_ = 0;
  local_2a8.elemsize._0_4_ = 0;
  local_2a8.elemsize._4_4_ = 0;
  local_2a8.elempack = 0;
  local_2a8.allocator = (Allocator *)0x0;
  local_2a8.dims = 0;
  local_2a8.w = 0;
  local_2a8.h = 0;
  local_2a8.d = 0;
  local_2a8.c = 0;
  local_b0 = top_blobs;
  if (local_238.elempack == 1) {
    piVar5 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    local_2a8.data = local_238.data;
    local_2a8.refcount._0_4_ = local_238.refcount._0_4_;
    local_2a8.refcount._4_4_ = local_238.refcount._4_4_;
    local_2a8.elemsize._0_4_ = (undefined4)local_238.elemsize;
    local_2a8.elemsize._4_4_ = local_238.elemsize._4_4_;
    local_2a8.elempack = local_238.elempack;
    local_2a8.allocator = local_238.allocator;
    local_2a8.dims = local_238.dims;
    local_2a8.w = local_238.w;
    local_2a8.h = local_238.h;
    local_2a8.d = local_238.d;
    local_2a8.c = local_238.c;
    local_2a8.cstep = local_238.cstep;
  }
  else {
    convert_packing(&local_238,&local_2a8,1,opt);
  }
  iVar17 = *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]) /
           *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86[-3]);
  iVar21 = pMVar4->elempack * pMVar4->h;
  iVar2 = pMVar24->elempack;
  iVar3 = pMVar24->h;
  local_158 = 0;
  local_198 = (void *)0x0;
  uStack_190 = 0;
  uStack_18c = 0;
  local_188 = 0;
  uStack_184 = 0;
  local_180 = 0;
  local_178 = (long *)0x0;
  uStack_170 = 0;
  iStack_16c = 0;
  uStack_168 = 0;
  uStack_164 = 0;
  local_160 = 0;
  local_a8 = pMVar23;
  (*this->q_gemm->_vptr_Layer[7])(this->q_gemm,pMVar4,&local_198,opt);
  local_1a8 = 0;
  local_1e8 = (void *)0x0;
  uStack_1e0 = 0;
  uStack_1dc = 0;
  local_1d8 = 0;
  uStack_1d4 = 0;
  local_1d0 = 0;
  local_1c8 = (long *)0x0;
  uStack_1c0 = 0;
  iStack_1bc = 0;
  uStack_1b8 = 0;
  uStack_1b4 = 0;
  local_1b0 = 0;
  (*this->k_gemm->_vptr_Layer[7])(this->k_gemm,pMVar24,&local_1e8,opt);
  local_f8.cstep = 0;
  local_f8.data = (void *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize._0_4_ = 0;
  local_f8.elemsize._4_4_ = 0;
  local_f8.elempack = 0;
  local_f8.allocator = (Allocator *)0x0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
  Mat::create(&local_f8,iVar2 * iVar3,
              *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86[-3]) * iVar21,4,
              opt->blob_allocator);
  local_2b8 = (long)iVar17;
  local_248 = (long)iVar21;
  local_2ac = iVar21;
  local_250 = opt;
  local_240 = this;
  if (0 < *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86[-3])) {
    lVar18 = 0;
    local_318 = 0;
    local_2c0 = 0;
    do {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_148,2,
                 (allocator_type *)&local_308);
      pvVar25 = local_148.data;
      iVar2 = iStack_16c;
      plVar9 = local_178;
      uVar14 = local_180;
      lVar20 = (long)iStack_16c;
      lVar19 = CONCAT44(uStack_184,local_188);
      pvVar22 = (void *)(lVar18 * lVar20 * lVar19 + (long)local_198);
      piVar5 = *(int **)((long)local_148.data + 8);
      local_258 = lVar18;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (*(long **)((long)local_148.data + 0x20) == (long *)0x0) {
            if (*local_148.data != (void *)0x0) {
              free(*local_148.data);
            }
          }
          else {
            (**(code **)(**(long **)((long)local_148.data + 0x20) + 0x18))();
          }
        }
      }
      pvVar15 = local_148.data;
      iVar3 = iStack_1bc;
      plVar13 = local_1c8;
      uVar12 = local_1d0;
      *(long *)pvVar25 = 0;
      *(long *)((long)pvVar25 + 8) = 0;
      *(undefined8 *)((long)pvVar25 + 0xc) = 0;
      *(undefined8 *)((long)pvVar25 + 0x14) = 0;
      *(long *)((long)pvVar25 + 0x28) = 0;
      *(long *)((long)pvVar25 + 0x30) = 0;
      *(void **)pvVar25 = pvVar22;
      *(long *)((long)pvVar25 + 8) = 0;
      *(long *)((long)pvVar25 + 0x10) = lVar19;
      *(undefined4 *)((long)pvVar25 + 0x18) = uVar14;
      *(long **)((long)pvVar25 + 0x20) = plVar9;
      *(undefined4 *)((long)pvVar25 + 0x28) = 2;
      *(int *)((long)pvVar25 + 0x2c) = iVar2;
      *(int *)((long)pvVar25 + 0x30) = iVar17;
      *(undefined4 *)((long)pvVar25 + 0x34) = 1;
      *(undefined4 *)((long)pvVar25 + 0x38) = 1;
      *(long *)((long)pvVar25 + 0x40) = lVar20 * local_2b8;
      lVar19 = (long)iStack_1bc;
      lVar18 = CONCAT44(uStack_1d4,local_1d8);
      pvVar25 = (void *)(local_258 * lVar19 * lVar18 + (long)local_1e8);
      piVar5 = *(int **)((long)local_148.data + 0x50);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (*(long **)((long)local_148.data + 0x68) == (long *)0x0) {
            if (*(void **)((long)local_148.data + 0x48) != (void *)0x0) {
              free(*(void **)((long)local_148.data + 0x48));
            }
          }
          else {
            (**(code **)(**(long **)((long)local_148.data + 0x68) + 0x18))();
          }
        }
      }
      *(long *)((long)pvVar15 + 0x88) = 0;
      *(undefined8 *)((long)pvVar15 + 0x54) = 0;
      *(undefined8 *)((long)pvVar15 + 0x5c) = 0;
      *(long *)((long)pvVar15 + 0x48) = 0;
      *(long *)((long)pvVar15 + 0x50) = 0;
      *(long *)((long)pvVar15 + 0x70) = 0;
      *(long *)((long)pvVar15 + 0x78) = 0;
      *(void **)((long)pvVar15 + 0x48) = pvVar25;
      *(long *)((long)pvVar15 + 0x50) = 0;
      *(long *)((long)pvVar15 + 0x58) = lVar18;
      *(undefined4 *)((long)pvVar15 + 0x60) = uVar12;
      *(long **)((long)pvVar15 + 0x68) = plVar13;
      *(undefined4 *)((long)pvVar15 + 0x70) = 2;
      *(int *)((long)pvVar15 + 0x74) = iVar3;
      *(int *)((long)pvVar15 + 0x78) = iVar17;
      *(undefined4 *)((long)pvVar15 + 0x7c) = 1;
      *(undefined4 *)((long)pvVar15 + 0x80) = 1;
      *(long *)((long)pvVar15 + 0x88) = lVar19 * local_2b8;
      if (*(int *)(&local_240->field_0xe4 + (long)local_240->_vptr_MultiHeadAttention_x86[-3]) != 0)
      {
        if (local_2a8.dims == 3) {
          local_308.cstep = CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize);
          local_308.data =
               (void *)(local_2a8.cstep * local_2c0 * local_308.cstep + (long)local_2a8.data);
          local_308.refcount._0_4_ = 0;
          local_308.refcount._4_4_ = 0;
          local_308.d = 1;
          local_308.c = local_2a8.d;
          local_308.cstep =
               ((long)local_2a8.h * (long)local_2a8.w * local_308.cstep + 0xf & 0xfffffffffffffff0)
               / local_308.cstep;
          local_308.dims = 2;
        }
        else {
          piVar5 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
          local_308.data = local_2a8.data;
          local_308.refcount._0_4_ = local_2a8.refcount._0_4_;
          local_308.refcount._4_4_ = local_2a8.refcount._4_4_;
          local_308.dims = local_2a8.dims;
          local_308.d = local_2a8.d;
          local_308.c = local_2a8.c;
          local_308.cstep = local_2a8.cstep;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
        }
        local_308.h = local_2a8.h;
        local_308.w = local_2a8.w;
        local_308.allocator = local_2a8.allocator;
        local_308.elempack = local_2a8.elempack;
        local_308.elemsize._4_4_ = local_2a8.elemsize._4_4_;
        local_308.elemsize._0_4_ = (undefined4)local_2a8.elemsize;
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_148,&local_308);
        piVar5 = (int *)CONCAT44(local_308.refcount._4_4_,local_308.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_308.allocator == (Allocator *)0x0) {
              if (local_308.data != (void *)0x0) {
                free(local_308.data);
              }
            }
            else {
              (*(local_308.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_308.cstep = 0;
        local_308.data = (void *)0x0;
        local_308.refcount._0_4_ = 0;
        local_308.refcount._4_4_ = 0;
        local_308.elemsize._0_4_ = 0;
        local_308.elemsize._4_4_ = 0;
        local_308.elempack = 0;
        local_308.dims = 0;
        local_308.w = 0;
        local_308.h = 0;
        local_308.d = 0;
        local_308.c = 0;
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                (&local_88,1,(allocator_type *)&local_308);
      iVar3 = local_f8.w;
      pAVar16 = local_f8.allocator;
      iVar2 = local_f8.elempack;
      lVar19 = (long)local_f8.w;
      lVar18 = CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
      pvVar25 = (void *)(local_318 * lVar19 * lVar18 + (long)local_f8.data);
      plVar9 = (long *)CONCAT44(local_88.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_88.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_);
      piVar5 = (int *)plVar9[1];
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if ((long *)plVar9[4] == (long *)0x0) {
            if ((void *)*plVar9 != (void *)0x0) {
              free((void *)*plVar9);
            }
          }
          else {
            (**(code **)(*(long *)plVar9[4] + 0x18))();
          }
        }
      }
      this = local_240;
      lVar20 = local_248;
      opt = local_250;
      iVar21 = local_2ac;
      *plVar9 = 0;
      plVar9[1] = 0;
      *(undefined8 *)((long)plVar9 + 0xc) = 0;
      *(undefined8 *)((long)plVar9 + 0x14) = 0;
      plVar9[5] = 0;
      plVar9[6] = 0;
      *plVar9 = (long)pvVar25;
      plVar9[1] = 0;
      plVar9[2] = lVar18;
      *(int *)(plVar9 + 3) = iVar2;
      plVar9[4] = (long)pAVar16;
      *(undefined4 *)(plVar9 + 5) = 2;
      *(int *)((long)plVar9 + 0x2c) = iVar3;
      *(int *)(plVar9 + 6) = local_2ac;
      *(undefined4 *)((long)plVar9 + 0x34) = 1;
      *(undefined4 *)(plVar9 + 7) = 1;
      plVar9[8] = lVar19 * local_248;
      local_308.refcount._0_4_ = *(undefined4 *)&local_250->blob_allocator;
      local_308.refcount._4_4_ = *(undefined4 *)((long)&local_250->blob_allocator + 4);
      local_308.elemsize._0_4_ = *(undefined4 *)&local_250->workspace_allocator;
      local_308.elemsize._4_4_ = *(undefined4 *)((long)&local_250->workspace_allocator + 4);
      local_308.elempack = local_250->openmp_blocktime;
      local_308._28_1_ = local_250->use_winograd_convolution;
      local_308._29_1_ = local_250->use_sgemm_convolution;
      local_308._30_1_ = local_250->use_int8_inference;
      local_308._31_1_ = local_250->use_vulkan_compute;
      local_308.allocator = *(Allocator **)&local_250->use_bf16_storage;
      local_308.dims._0_1_ = local_250->use_shader_pack8;
      local_308.dims._1_1_ = local_250->use_subgroup_basic;
      local_308.dims._2_1_ = local_250->use_subgroup_vote;
      local_308.dims._3_1_ = local_250->use_subgroup_ballot;
      local_308.w._0_1_ = local_250->use_subgroup_shuffle;
      local_308.w._1_1_ = local_250->use_image_storage;
      local_308.w._2_1_ = local_250->use_tensor_storage;
      local_308.w._3_1_ = local_250->use_reserved_0;
      local_308.h = local_250->flush_denormals;
      local_308.d._0_1_ = local_250->use_local_pool_allocator;
      local_308.d._1_1_ = local_250->use_shader_local_memory;
      local_308.d._2_1_ = local_250->use_cooperative_matrix;
      local_308.d._3_1_ = local_250->use_winograd23_convolution;
      local_308.c._0_1_ = local_250->use_winograd43_convolution;
      local_308.c._1_1_ = local_250->use_winograd63_convolution;
      local_308.c._2_1_ = local_250->use_a53_a55_optimized_kernel;
      local_308.c._3_1_ = local_250->use_reserved_7;
      local_308._60_1_ = local_250->use_reserved_8;
      local_308._61_1_ = local_250->use_reserved_9;
      local_308._62_1_ = local_250->use_reserved_10;
      local_308._63_1_ = local_250->use_reserved_11;
      local_308.data = (void *)CONCAT44(1,*(undefined4 *)local_250);
      (*local_240->qk_gemm->_vptr_Layer[6])(local_240->qk_gemm,&local_148,&local_88,&local_308);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_88);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_148);
      local_2c0 = local_2c0 + 1;
      local_318 = local_318 + lVar20;
      lVar18 = local_258 + local_2b8;
    } while (local_2c0 < *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86[-3]))
    ;
  }
  piVar5 = (int *)CONCAT44(uStack_18c,uStack_190);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_178 == (long *)0x0) {
        if (local_198 != (void *)0x0) {
          free(local_198);
        }
      }
      else {
        (**(code **)(*local_178 + 0x18))();
      }
    }
  }
  local_158 = 0;
  local_198 = (void *)0x0;
  uStack_190 = 0;
  uStack_18c = 0;
  local_188 = 0;
  uStack_184 = 0;
  local_180 = 0;
  uStack_170 = 0;
  iStack_16c = 0;
  uStack_168 = 0;
  uStack_164 = 0;
  local_160 = 0;
  piVar5 = (int *)CONCAT44(uStack_1dc,uStack_1e0);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_1c8 == (long *)0x0) {
        if (local_1e8 != (void *)0x0) {
          free(local_1e8);
        }
      }
      else {
        (**(code **)(*local_1c8 + 0x18))();
      }
    }
  }
  local_1a8 = 0;
  local_1e8 = (void *)0x0;
  uStack_1e0 = 0;
  uStack_1dc = 0;
  local_1d8 = 0;
  uStack_1d4 = 0;
  local_1d0 = 0;
  uStack_1c0 = 0;
  iStack_1bc = 0;
  uStack_1b8 = 0;
  uStack_1b4 = 0;
  local_1b0 = 0;
  (*this->qk_softmax->_vptr_Layer[9])(this->qk_softmax,&local_f8,opt);
  local_308.cstep = 0;
  local_308.data = (void *)0x0;
  local_308.refcount._0_4_ = 0;
  local_308.refcount._4_4_ = 0;
  local_308.elemsize._0_4_ = 0;
  local_308.elemsize._4_4_ = 0;
  local_308.elempack = 0;
  local_308.allocator = (Allocator *)0x0;
  local_308.dims = 0;
  local_308.w = 0;
  local_308.h = 0;
  local_308.d = 0;
  local_308.c = 0;
  (*this->v_gemm->_vptr_Layer[7])(this->v_gemm,local_a8,&local_308,opt);
  local_148.cstep = 0;
  local_148.data = (void *)0x0;
  local_148.refcount._0_4_ = 0;
  local_148.refcount._4_4_ = 0;
  local_148.elemsize._0_4_ = 0;
  local_148.elemsize._4_4_ = 0;
  local_148.elempack = 0;
  local_148.allocator = (Allocator *)0x0;
  local_148.dims = 0;
  local_148.w = 0;
  local_148.h = 0;
  local_148.d = 0;
  local_148.c = 0;
  Mat::create(&local_148,iVar21,
              *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86[-3]) * iVar17,4,
              opt->blob_allocator);
  if (0 < *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86[-3])) {
    lVar19 = 0;
    lVar20 = 0;
    lVar18 = 0;
    do {
      local_258 = lVar18;
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                (&local_a0,2,(allocator_type *)&local_88);
      pMVar24 = local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar3 = local_f8.w;
      pAVar16 = local_f8.allocator;
      iVar2 = local_f8.elempack;
      lVar18 = (long)local_f8.w;
      sVar8 = CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
      pvVar25 = (void *)(lVar19 * lVar18 * sVar8 + (long)local_f8.data);
      piVar5 = (local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start)->refcount;
      local_2c0 = lVar19;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if ((local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
            if ((local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->data != (void *)0x0) {
              free((local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start)->data);
            }
          }
          else {
            (*(local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar4 = local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar11 = local_308.w;
      pAVar10 = local_308.allocator;
      iVar21 = local_308.elempack;
      pMVar24->data = (void *)0x0;
      pMVar24->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar24->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar24->elemsize + 4) = 0;
      pMVar24->dims = 0;
      pMVar24->w = 0;
      pMVar24->h = 0;
      pMVar24->d = 0;
      pMVar24->data = pvVar25;
      pMVar24->refcount = (int *)0x0;
      pMVar24->elemsize = sVar8;
      pMVar24->elempack = iVar2;
      pMVar24->allocator = pAVar16;
      pMVar24->dims = 2;
      pMVar24->w = iVar3;
      pMVar24->h = local_2ac;
      pMVar24->d = 1;
      pMVar24->c = 1;
      pMVar24->cstep = lVar18 * local_248;
      lVar18 = (long)local_308.w;
      sVar8 = CONCAT44(local_308.elemsize._4_4_,(undefined4)local_308.elemsize);
      pvVar25 = (void *)(lVar20 * lVar18 * sVar8 + (long)local_308.data);
      piVar5 = local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start[1].refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
            if (local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start[1].data != (void *)0x0) {
              free(local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start[1].data);
            }
          }
          else {
            (*(local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
          }
        }
      }
      pMVar4[1].cstep = 0;
      *(undefined8 *)((long)&pMVar4[1].refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar4[1].elemsize + 4) = 0;
      pMVar4[1].data = (void *)0x0;
      pMVar4[1].refcount = (int *)0x0;
      pMVar4[1].dims = 0;
      pMVar4[1].w = 0;
      pMVar4[1].h = 0;
      pMVar4[1].d = 0;
      pMVar4[1].data = pvVar25;
      pMVar4[1].refcount = (int *)0x0;
      pMVar4[1].elemsize = sVar8;
      pMVar4[1].elempack = iVar21;
      pMVar4[1].allocator = pAVar10;
      pMVar4[1].dims = 2;
      pMVar4[1].w = iVar11;
      pMVar4[1].h = iVar17;
      pMVar4[1].d = 1;
      pMVar4[1].c = 1;
      pMVar4[1].cstep = lVar18 * local_2b8;
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                (&local_48,1,(allocator_type *)&local_88);
      pMVar24 = local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar3 = local_148.w;
      pAVar16 = local_148.allocator;
      iVar2 = local_148.elempack;
      lVar18 = (long)local_148.w;
      sVar8 = CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
      pvVar25 = (void *)((long)local_148.data + lVar20 * lVar18 * sVar8);
      piVar5 = (local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start)->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if ((local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
            if ((local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->data != (void *)0x0) {
              free((local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start)->data);
            }
          }
          else {
            (*(local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
          }
        }
      }
      this = local_240;
      lVar19 = local_2b8;
      pMVar24->data = (void *)0x0;
      pMVar24->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar24->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar24->elemsize + 4) = 0;
      pMVar24->dims = 0;
      pMVar24->w = 0;
      pMVar24->h = 0;
      pMVar24->d = 0;
      pMVar24->data = pvVar25;
      pMVar24->refcount = (int *)0x0;
      pMVar24->elemsize = sVar8;
      pMVar24->elempack = iVar2;
      pMVar24->allocator = pAVar16;
      pMVar24->dims = 2;
      pMVar24->w = iVar3;
      pMVar24->h = iVar17;
      pMVar24->d = 1;
      pMVar24->c = 1;
      pMVar24->cstep = lVar18 * local_2b8;
      local_88.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)local_250;
      local_88.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = *(undefined4 *)&local_250->blob_allocator;
      local_88.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ =
           *(undefined4 *)((long)&local_250->blob_allocator + 4);
      local_88.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           *(undefined4 *)&local_250->workspace_allocator;
      local_88.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           *(undefined4 *)((long)&local_250->workspace_allocator + 4);
      iStack_70 = local_250->openmp_blocktime;
      uStack_6c._0_1_ = local_250->use_winograd_convolution;
      uStack_6c._1_1_ = local_250->use_sgemm_convolution;
      uStack_6c._2_1_ = local_250->use_int8_inference;
      uStack_6c._3_1_ = local_250->use_vulkan_compute;
      local_68._0_1_ = local_250->use_bf16_storage;
      local_68._1_1_ = local_250->use_fp16_packed;
      local_68._2_1_ = local_250->use_fp16_storage;
      local_68._3_1_ = local_250->use_fp16_arithmetic;
      uStack_64._0_1_ = local_250->use_int8_packed;
      uStack_64._1_1_ = local_250->use_int8_storage;
      uStack_64._2_1_ = local_250->use_int8_arithmetic;
      uStack_64._3_1_ = local_250->use_packing_layout;
      uStack_60._0_1_ = local_250->use_shader_pack8;
      uStack_60._1_1_ = local_250->use_subgroup_basic;
      uStack_60._2_1_ = local_250->use_subgroup_vote;
      uStack_60._3_1_ = local_250->use_subgroup_ballot;
      uStack_5c._0_1_ = local_250->use_subgroup_shuffle;
      uStack_5c._1_1_ = local_250->use_image_storage;
      uStack_5c._2_1_ = local_250->use_tensor_storage;
      uStack_5c._3_1_ = local_250->use_reserved_0;
      local_58 = local_250->flush_denormals;
      uStack_54._0_1_ = local_250->use_local_pool_allocator;
      uStack_54._1_1_ = local_250->use_shader_local_memory;
      uStack_54._2_1_ = local_250->use_cooperative_matrix;
      uStack_54._3_1_ = local_250->use_winograd23_convolution;
      uStack_50._0_1_ = local_250->use_winograd43_convolution;
      uStack_50._1_1_ = local_250->use_winograd63_convolution;
      uStack_50._2_1_ = local_250->use_a53_a55_optimized_kernel;
      uStack_50._3_1_ = local_250->use_reserved_7;
      uStack_4c._0_1_ = local_250->use_reserved_8;
      uStack_4c._1_1_ = local_250->use_reserved_9;
      uStack_4c._2_1_ = local_250->use_reserved_10;
      uStack_4c._3_1_ = local_250->use_reserved_11;
      local_88.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = 1;
      (*local_240->qkv_gemm->_vptr_Layer[6])(local_240->qkv_gemm,&local_a0,&local_48,&local_88);
      lVar18 = local_258;
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_48);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_a0);
      lVar18 = lVar18 + 1;
      lVar20 = lVar20 + lVar19;
      lVar19 = local_2c0 + local_248;
    } while (lVar18 < *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  }
  piVar5 = (int *)CONCAT44(local_308.refcount._4_4_,local_308.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_308.allocator == (Allocator *)0x0) {
        if (local_308.data != (void *)0x0) {
          free(local_308.data);
        }
      }
      else {
        (*(local_308.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_308.cstep = 0;
  local_308.data = (void *)0x0;
  local_308.refcount._0_4_ = 0;
  local_308.refcount._4_4_ = 0;
  local_308.elemsize._0_4_ = 0;
  local_308.elemsize._4_4_ = 0;
  local_308.elempack = 0;
  local_308.dims = 0;
  local_308.w = 0;
  local_308.h = 0;
  local_308.d = 0;
  local_308.c = 0;
  (*this->o_gemm->_vptr_Layer[7])
            (this->o_gemm,&local_148,
             (local_b0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start,local_250);
  piVar5 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_148.allocator == (Allocator *)0x0) {
        if (local_148.data != (void *)0x0) {
          free(local_148.data);
        }
      }
      else {
        (*(local_148.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_148.cstep = 0;
  local_148.data = (void *)0x0;
  local_148.refcount._0_4_ = 0;
  local_148.refcount._4_4_ = 0;
  local_148.elemsize._0_4_ = 0;
  local_148.elemsize._4_4_ = 0;
  local_148.elempack = 0;
  local_148.dims = 0;
  local_148.w = 0;
  local_148.h = 0;
  local_148.d = 0;
  local_148.c = 0;
  piVar5 = (int *)CONCAT44(local_308.refcount._4_4_,local_308.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_308.allocator == (Allocator *)0x0) {
        if (local_308.data != (void *)0x0) {
          free(local_308.data);
        }
      }
      else {
        (*(local_308.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_308.cstep = 0;
  local_308.data = (void *)0x0;
  local_308.refcount._0_4_ = 0;
  local_308.refcount._4_4_ = 0;
  local_308.elemsize._0_4_ = 0;
  local_308.elemsize._4_4_ = 0;
  local_308.elempack = 0;
  local_308.dims = 0;
  local_308.w = 0;
  local_308.h = 0;
  local_308.d = 0;
  local_308.c = 0;
  piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if (local_f8.data != (void *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_f8.cstep = 0;
  local_f8.data = (void *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize._0_4_ = 0;
  local_f8.elemsize._4_4_ = 0;
  local_f8.elempack = 0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
  piVar5 = (int *)CONCAT44(uStack_1dc,uStack_1e0);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_1c8 == (long *)0x0) {
        if (local_1e8 != (void *)0x0) {
          free(local_1e8);
        }
      }
      else {
        (**(code **)(*local_1c8 + 0x18))();
      }
    }
  }
  local_1a8 = 0;
  local_1e8 = (void *)0x0;
  uStack_1e0 = 0;
  uStack_1dc = 0;
  local_1d8 = 0;
  uStack_1d4 = 0;
  local_1d0 = 0;
  uStack_1c0 = 0;
  iStack_1bc = 0;
  uStack_1b8 = 0;
  uStack_1b4 = 0;
  local_1b0 = 0;
  piVar5 = (int *)CONCAT44(uStack_18c,uStack_190);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_178 == (long *)0x0) {
        if (local_198 != (void *)0x0) {
          free(local_198);
        }
      }
      else {
        (**(code **)(*local_178 + 0x18))();
      }
    }
  }
  local_158 = 0;
  local_198 = (void *)0x0;
  uStack_190 = 0;
  uStack_18c = 0;
  local_188 = 0;
  uStack_184 = 0;
  local_180 = 0;
  uStack_170 = 0;
  iStack_16c = 0;
  uStack_168 = 0;
  uStack_164 = 0;
  local_160 = 0;
  piVar5 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_2a8.allocator == (Allocator *)0x0) {
        if (local_2a8.data != (void *)0x0) {
          free(local_2a8.data);
        }
      }
      else {
        (*(local_2a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_2a8.cstep = 0;
  local_2a8.data = (void *)0x0;
  local_2a8.refcount._0_4_ = 0;
  local_2a8.refcount._4_4_ = 0;
  local_2a8.elemsize._0_4_ = 0;
  local_2a8.elemsize._4_4_ = 0;
  local_2a8.elempack = 0;
  local_2a8.dims = 0;
  local_2a8.w = 0;
  local_2a8.h = 0;
  local_2a8.d = 0;
  local_2a8.c = 0;
  piVar5 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_238.allocator == (Allocator *)0x0) {
        if (local_238.data != (void *)0x0) {
          free(local_238.data);
        }
      }
      else {
        (*(local_238.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int MultiHeadAttention_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    Mat attn_mask_blob_unpacked;
    if (attn_mask_blob.elempack != 1)
    {
        convert_packing(attn_mask_blob, attn_mask_blob_unpacked, 1, opt);
    }
    else
    {
        attn_mask_blob_unpacked = attn_mask_blob;
    }

    const int embed_dim_per_head = embed_dim / num_heads;
    const int src_seqlen = q_blob.h * q_blob.elempack;
    const int dst_seqlen = k_blob.h * k_blob.elempack;

    Mat q_affine;
    q_gemm->forward(q_blob, q_affine, opt);

    Mat k_affine;
    k_gemm->forward(k_blob, k_affine, opt);

    Mat qk_cross(dst_seqlen, src_seqlen * num_heads, 4u, opt.blob_allocator);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qk_bottom_blobs(2);
        qk_bottom_blobs[0] = q_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        qk_bottom_blobs[1] = k_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob_unpacked.dims == 3 ? attn_mask_blob_unpacked.channel(i) : attn_mask_blob_unpacked;
            qk_bottom_blobs.push_back(maskm);
        }
        std::vector<Mat> qk_top_blobs(1);
        qk_top_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        Option opt1 = opt;
        opt1.num_threads = 1;
        qk_gemm->forward(qk_bottom_blobs, qk_top_blobs, opt1);
    }

    q_affine.release();
    k_affine.release();

    qk_softmax->forward_inplace(qk_cross, opt);

    Mat v_affine;
    v_gemm->forward(v_blob, v_affine, opt);

    Mat qkv_cross(src_seqlen, embed_dim_per_head * num_heads, 4u, opt.blob_allocator);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qkv_bottom_blobs(2);
        qkv_bottom_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        qkv_bottom_blobs[1] = v_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        std::vector<Mat> qkv_top_blobs(1);
        qkv_top_blobs[0] = qkv_cross.row_range(i * embed_dim_per_head, embed_dim_per_head);
        Option opt1 = opt;
        opt1.num_threads = 1;
        qkv_gemm->forward(qkv_bottom_blobs, qkv_top_blobs, opt1);
    }

    v_affine.release();

    o_gemm->forward(qkv_cross, top_blobs[0], opt);

    return 0;
}